

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tile.cpp
# Opt level: O1

bool __thiscall Tile::isDataEqual(Tile *this,Tile *anotherTile)

{
  int count;
  long lVar1;
  
  lVar1 = 0;
  do {
    if (this->data[lVar1] != anotherTile->data[lVar1]) goto LAB_0011696c;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x40);
  lVar1 = 0x40;
LAB_0011696c:
  return (int)lVar1 == 0x40;
}

Assistant:

bool Tile::isDataEqual(Tile *anotherTile) {
    int count = 0;
    for (; count < NUM_PIXELS_IN_TILE; count++) {
        if (data[count] != anotherTile->data[count]) {
            break;
        }
    }
    if (count == NUM_PIXELS_IN_TILE) {
        return true;
    }
    return false;
}